

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool loadKeyPresses<short>
               (string *fname,TWaveformViewT<short> *waveform,
               TKeyPressCollectionT<short> *keyPresses)

{
  undefined8 *puVar1;
  pointer psVar2;
  int64_t iVar3;
  int i;
  long lVar4;
  long lVar5;
  int n;
  ifstream fin;
  
  psVar2 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar2) {
    (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar2;
  }
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin);
  n = 0;
  std::istream::read((char *)&fin,(long)&n);
  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::resize
            (&keyPresses->
              super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,(long)n);
  lVar5 = 0x10;
  for (lVar4 = 0; lVar4 < n; lVar4 = lVar4 + 1) {
    iVar3 = waveform->n;
    puVar1 = (undefined8 *)
             ((long)(keyPresses->
                    super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x10);
    *puVar1 = waveform->samples;
    puVar1[1] = iVar3;
    std::istream::read((char *)&fin,
                       (long)&(((keyPresses->
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ).
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->waveform).samples +
                       lVar5);
    lVar5 = lVar5 + 0x30;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&fin);
  return true;
}

Assistant:

bool loadKeyPresses(const std::string & fname, const TWaveformViewT<T> & waveform, TKeyPressCollectionT<T> & keyPresses) {
    keyPresses.clear();

    std::ifstream fin(fname, std::ios::binary);
    int n = 0;
    fin.read((char *)(&n), sizeof(n));
    keyPresses.resize(n);
    for (int i = 0; i < n; ++i) {
        keyPresses[i].waveform = waveform;
        fin.read((char *)(&keyPresses[i].pos), sizeof(keyPresses[i].pos));
    }
    fin.close();

    return true;
}